

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_put(mcbsp_pid_t pid,void *src,void *dst,mcbsp_size_t offset,mcbsp_size_t size)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Memslot slot;
  Memblock *pMVar4;
  Memblock dst_slot;
  Memslot dst_slot_id;
  undefined1 local_50 [8];
  TicToc t;
  mcbsp_size_t size_local;
  mcbsp_size_t offset_local;
  void *dst_local;
  void *src_local;
  mcbsp_pid_t pid_local;
  
  t.m_nbytes = size;
  bsplib::TicToc::TicToc((TicToc *)local_50,PUT,size);
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_put: can only be called within SPMD section\n");
  }
  if (t.m_nbytes != 0) {
    uVar3 = bsplib::Spmd::nprocs(s_spmd);
    if (uVar3 < pid) {
      bsp_abort("bsp_put: The destination process ID does not exist\n");
    }
    if (dst == (void *)0x0) {
      bsp_abort("bsp_put: Destination address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(dst,"bsp_put");
    pMVar4 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar4->size;
    if (uVar1 < offset + t.m_nbytes) {
      bsp_abort("bsp_put: Writes %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (offset + t.m_nbytes) - uVar1,pMVar4->addr,pMVar4->addr,uVar1,(ulong)pid);
    }
    bsplib::Rdma::put(s_rdma,src,pid,slot,offset,t.m_nbytes);
  }
  bsplib::TicToc::~TicToc((TicToc *)local_50);
  return;
}

Assistant:

void mcbsp_put( mcbsp_pid_t pid, const void * src,
             const void * dst, mcbsp_size_t offset, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::PUT, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_put: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty writes
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_put: The destination process ID does not exist\n");

    if ( dst == NULL )
        bsp_abort("bsp_put: Destination address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot dst_slot_id = lookup_usable_reg( dst, "bsp_put"); 

    bsplib::Rdma::Memblock dst_slot = s_rdma->slot( pid, dst_slot_id );

    if ( size_t(offset + size) > dst_slot.size )
        bsp_abort("bsp_put: Writes %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - dst_slot.size,
                  dst_slot.addr, dst_slot.addr, dst_slot.size, pid );

    s_rdma->put( src, pid, dst_slot_id, offset, size );

}